

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.h
# Opt level: O2

double rapidjson::internal::StrtodFullPrecision
                 (double d,int p,char *decimals,size_t length,size_t decimalPosition,int exp)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  RapidJSONException *this;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  double dVar14;
  double result;
  
  if (d < 0.0) {
    this = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (this,"rapidjson internal assertion failure: d >= 0.0");
  }
  else if (length == 0) {
    this = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (this,"rapidjson internal assertion failure: length >= 1");
  }
  else {
    result = 0.0;
    bVar1 = StrtodFast(d,p,&result);
    if (bVar1) {
      return result;
    }
    if (length >> 0x1f == 0) {
      if (length < decimalPosition) {
        this = (RapidJSONException *)__cxa_allocate_exception(0x10);
        cereal::RapidJSONException::RapidJSONException
                  (this,"rapidjson internal assertion failure: length >= decimalPosition");
      }
      else if (length - decimalPosition < 0x80000000) {
        uVar2 = (uint)(length - decimalPosition);
        if (exp < (int)(uVar2 | 0x80000000)) {
          this = (RapidJSONException *)__cxa_allocate_exception(0x10);
          cereal::RapidJSONException::RapidJSONException
                    (this,"rapidjson internal assertion failure: exp >= INT_MIN + dExpAdjust");
        }
        else {
          if ((int)(exp - uVar2) <= (int)((uint)length ^ 0x7fffffff)) {
            pcVar9 = decimals + -1;
            uVar6 = length & 0xffffffff;
            for (; (iVar4 = (int)uVar6, 0 < iVar4 && (*decimals == '0')); decimals = decimals + 1) {
              uVar6 = (ulong)(iVar4 - 1);
              pcVar9 = pcVar9 + 1;
            }
            lVar3 = 0;
            uVar10 = 0;
            uVar11 = 0;
            if (0 < iVar4) {
              uVar10 = uVar6;
              uVar11 = uVar6;
            }
            while( true ) {
              iVar13 = (int)lVar3;
              iVar8 = (int)uVar10;
              if ((int)uVar11 + iVar13 < 1) break;
              if (pcVar9[lVar3 + uVar11] != '0') goto LAB_0013d827;
              lVar3 = lVar3 + -1;
              uVar10 = (ulong)(iVar8 - 1);
            }
            uVar10 = 0;
            if (0 < iVar4) {
              uVar10 = uVar6;
            }
            if (uVar10 + lVar3 == 0) {
              return 0.0;
            }
LAB_0013d827:
            iVar5 = 0;
            if (0 < iVar4) {
              iVar5 = iVar4;
            }
            iVar4 = iVar13 + iVar5;
            if (0x2ff < iVar13 + iVar5) {
              iVar4 = 0x300;
            }
            iVar12 = (exp + (int)decimalPosition) - (uint)length;
            iVar5 = 0x300;
            if (0x300 < iVar8) {
              iVar5 = iVar8;
            }
            iVar7 = 0x300;
            if (iVar8 < 0x300) {
              iVar7 = iVar8;
            }
            iVar8 = (iVar7 + iVar12 + iVar5 + -0x300) - iVar13;
            if (iVar8 < -0x143) {
              return 0.0;
            }
            if (0x135 < iVar8) {
              return INFINITY;
            }
            iVar13 = (iVar12 + iVar5 + -0x300) - iVar13;
            bVar1 = StrtodDiyFp(decimals,iVar4,iVar13,&result);
            if (bVar1) {
              return result;
            }
            dVar14 = StrtodBigInteger(result,decimals,iVar4,iVar13);
            return dVar14;
          }
          this = (RapidJSONException *)__cxa_allocate_exception(0x10);
          cereal::RapidJSONException::RapidJSONException
                    (this,"rapidjson internal assertion failure: dExp <= INT_MAX - dLen");
        }
      }
      else {
        this = (RapidJSONException *)__cxa_allocate_exception(0x10);
        cereal::RapidJSONException::RapidJSONException
                  (this,"rapidjson internal assertion failure: length - decimalPosition <= INT_MAX")
        ;
      }
    }
    else {
      this = (RapidJSONException *)__cxa_allocate_exception(0x10);
      cereal::RapidJSONException::RapidJSONException
                (this,"rapidjson internal assertion failure: length <= INT_MAX");
    }
  }
  __cxa_throw(this,&cereal::RapidJSONException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline double StrtodFullPrecision(double d, int p, const char* decimals, size_t length, size_t decimalPosition, int exp) {
    CEREAL_RAPIDJSON_ASSERT(d >= 0.0);
    CEREAL_RAPIDJSON_ASSERT(length >= 1);

    double result = 0.0;
    if (StrtodFast(d, p, &result))
        return result;

    CEREAL_RAPIDJSON_ASSERT(length <= INT_MAX);
    int dLen = static_cast<int>(length);

    CEREAL_RAPIDJSON_ASSERT(length >= decimalPosition);
    CEREAL_RAPIDJSON_ASSERT(length - decimalPosition <= INT_MAX);
    int dExpAdjust = static_cast<int>(length - decimalPosition);

    CEREAL_RAPIDJSON_ASSERT(exp >= INT_MIN + dExpAdjust);
    int dExp = exp - dExpAdjust;

    // Make sure length+dExp does not overflow
    CEREAL_RAPIDJSON_ASSERT(dExp <= INT_MAX - dLen);

    // Trim leading zeros
    while (dLen > 0 && *decimals == '0') {
        dLen--;
        decimals++;
    }

    // Trim trailing zeros
    while (dLen > 0 && decimals[dLen - 1] == '0') {
        dLen--;
        dExp++;
    }

    if (dLen == 0) { // Buffer only contains zeros.
        return 0.0;
    }

    // Trim right-most digits
    const int kMaxDecimalDigit = 767 + 1;
    if (dLen > kMaxDecimalDigit) {
        dExp += dLen - kMaxDecimalDigit;
        dLen = kMaxDecimalDigit;
    }

    // If too small, underflow to zero.
    // Any x <= 10^-324 is interpreted as zero.
    if (dLen + dExp <= -324)
        return 0.0;

    // If too large, overflow to infinity.
    // Any x >= 10^309 is interpreted as +infinity.
    if (dLen + dExp > 309)
        return std::numeric_limits<double>::infinity();

    if (StrtodDiyFp(decimals, dLen, dExp, &result))
        return result;

    // Use approximation from StrtodDiyFp and make adjustment with BigInteger comparison
    return StrtodBigInteger(result, decimals, dLen, dExp);
}